

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayerThreadPool.cpp
# Opt level: O3

void __thiscall PyreNet::LayerThreadPool::addJob(LayerThreadPool *this,LayerQueueJob *job)

{
  iterator *piVar1;
  _Elt_pointer pLVar2;
  vector<double,_std::allocator<double>_> *pvVar3;
  Perceptron *pPVar4;
  int *piVar5;
  undefined1 local_30 [8];
  unique_lock<std::mutex> lg;
  
  local_30 = (undefined1  [8])&this->queueMutex;
  lg._M_device._0_1_ = 0;
  std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_30);
  lg._M_device._0_1_ = 1;
  pLVar2 = (this->layerQueue).c.
           super__Deque_base<PyreNet::LayerThreadPool::LayerQueueJob,_std::allocator<PyreNet::LayerThreadPool::LayerQueueJob>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pLVar2 == (this->layerQueue).c.
                super__Deque_base<PyreNet::LayerThreadPool::LayerQueueJob,_std::allocator<PyreNet::LayerThreadPool::LayerQueueJob>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::
    deque<PyreNet::LayerThreadPool::LayerQueueJob,std::allocator<PyreNet::LayerThreadPool::LayerQueueJob>>
    ::_M_push_back_aux<PyreNet::LayerThreadPool::LayerQueueJob_const&>
              ((deque<PyreNet::LayerThreadPool::LayerQueueJob,std::allocator<PyreNet::LayerThreadPool::LayerQueueJob>>
                *)&this->layerQueue,job);
  }
  else {
    pvVar3 = job->input;
    pPVar4 = job->p;
    piVar5 = job->track;
    pLVar2->activation = job->activation;
    pLVar2->track = piVar5;
    pLVar2->input = pvVar3;
    pLVar2->p = pPVar4;
    piVar1 = &(this->layerQueue).c.
              super__Deque_base<PyreNet::LayerThreadPool::LayerQueueJob,_std::allocator<PyreNet::LayerThreadPool::LayerQueueJob>_>
              ._M_impl.super__Deque_impl_data._M_finish;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  std::condition_variable::notify_one();
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_30);
  return;
}

Assistant:

void LayerThreadPool::addJob(const LayerThreadPool::LayerQueueJob &job) {
        std::unique_lock<std::mutex> lg(queueMutex);
        layerQueue.push(job);
        newJobCv.notify_one();
    }